

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShiftRoll.hpp
# Opt level: O0

void InstructionSet::x86::Primitive::
     sar<unsigned_char,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
               (modify_t<unsigned_char> destination,uint8_t count,Context *context)

{
  byte bVar1;
  int iVar2;
  undefined1 local_34;
  undefined1 local_29;
  uchar mask;
  uchar sign;
  Context *context_local;
  uint8_t count_local;
  modify_t<unsigned_char> destination_local;
  
  if (count != '\0') {
    bVar1 = Numeric::top_bit<unsigned_char>();
    bVar1 = bVar1 & *destination;
    iVar2 = Numeric::bit_size<unsigned_char>();
    if ((int)(uint)count < iVar2) {
      Flags::set_from<(InstructionSet::x86::Flag)0>
                (&context->flags,(uint)(*destination & (byte)(1 << (count - 1 & 0x1f))));
      if (bVar1 == 0) {
        local_34 = (byte)(0 >> (count & 0x1f));
      }
      else {
        local_34 = (byte)(0xff >> (count & 0x1f)) ^ 0xff;
      }
      *destination = (byte)((int)(uint)*destination >> (count & 0x1f)) | local_34;
    }
    else {
      local_29 = 0xff;
      if (bVar1 == 0) {
        local_29 = '\0';
      }
      *destination = local_29;
      Flags::set_from<(InstructionSet::x86::Flag)0>(&context->flags,(uint)bVar1);
    }
    Flags::set_from<(InstructionSet::x86::Flag)3>(&context->flags,0);
    Flags::
    set_from<unsigned_char,(InstructionSet::x86::Flag)2,(InstructionSet::x86::Flag)7,(InstructionSet::x86::Flag)8>
              (&context->flags,*destination);
  }
  return;
}

Assistant:

void sar(
	modify_t<IntT> destination,
	uint8_t count,
	ContextT &context
) {
	if(!count) {
		return;
	}

	const IntT sign = Numeric::top_bit<IntT>() & destination;
	if(count >= Numeric::bit_size<IntT>()) {
		destination = sign ? IntT(~0) : IntT(0);
		context.flags.template set_from<Flag::Carry>(sign);
	} else {
		const auto mask = IntT(1 << (count - 1));
		context.flags.template set_from<Flag::Carry>(destination & mask);
		destination = (destination >> count) | (sign ? ~(IntT(~0) >> count) : 0);
	}
	context.flags.template set_from<Flag::Overflow>(0);
	context.flags.template set_from<IntT, Flag::Sign, Flag::Zero, Flag::ParityOdd>(destination);
}